

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall
Database::iterator::iterator(iterator *this,files_iterator *fbegin,files_iterator *fend)

{
  Datafile *pDVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer pbVar4;
  Datafile *pDVar5;
  
  pDVar5 = (fbegin->current)._M_current;
  (this->files_it).current._M_current = pDVar5;
  pDVar1 = (fend->current)._M_current;
  (this->files_end).current._M_current = pDVar1;
  (this->lines_it).current._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->lines_end).current._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pDVar5 == pDVar1) {
    return;
  }
  do {
    pvVar3 = Datafile::allLines_abi_cxx11_(pDVar5 + -1);
    pbVar4 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (this->lines_it).current._M_current = pbVar4;
    pbVar2 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (this->lines_end).current._M_current = pbVar2;
    pDVar5 = (this->files_it).current._M_current;
    pDVar1 = (this->files_end).current._M_current;
    do {
      if (pbVar4 != pbVar2) {
        return;
      }
      if (pDVar5 == pDVar1) {
        return;
      }
      pDVar5 = pDVar5 + -1;
      (this->files_it).current._M_current = pDVar5;
      pbVar4 = pbVar2;
    } while (pDVar5 == pDVar1);
  } while( true );
}

Assistant:

Database::iterator::iterator (files_iterator fbegin, files_iterator fend) :
  files_it (fbegin),
  files_end (fend)
{
  if (files_end != files_it)
  {
    auto& lines = files_it->allLines ();
    lines_it = lines.rbegin ();
    lines_end = lines.rend ();
    while ((lines_it == lines_end) && (files_it != files_end))
    {
      ++files_it;
      if (files_it != files_end)
      {
        auto& lines = files_it->allLines ();
        lines_it = lines.rbegin ();
        lines_end = lines.rend ();
      }
    }
  }
}